

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O3

value * mjs::parse_value(value *__return_storage_ptr__,gc_heap *h,string *s)

{
  undefined8 uVar1;
  ushort uVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  runtime_error *this;
  long *plVar6;
  wostream *pwVar7;
  bool bVar8;
  undefined1 *rhs;
  ulong uVar9;
  gc_heap *pgVar10;
  uint uVar11;
  wstring res;
  anon_class_16_2_de30df33 require_complete;
  string type;
  string val;
  istringstream iss;
  undefined1 local_3c0 [32];
  value *local_3a0;
  anon_class_16_2_de30df33 local_398;
  undefined8 *local_388;
  undefined8 local_380;
  undefined1 local_378;
  undefined7 uStack_377;
  string *local_368;
  gc_heap *local_360;
  wstring_view local_358 [2];
  gc_heap_ptr_untyped local_338;
  gc_heap local_328 [3];
  wstring_view local_1c0;
  istringstream local_1b0 [16];
  long local_1a0 [2];
  long local_190;
  long local_188;
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)s,_S_in);
  local_388 = (undefined8 *)&local_378;
  local_380 = 0;
  local_378 = 0;
  local_398.iss = (istringstream *)local_1b0;
  local_398.s = s;
  piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_388);
  if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) goto LAB_0011564d;
  while ((local_188 != local_190 ||
         (lVar5 = (**(code **)(local_1a0[0] + 0x38))(local_1a0), lVar5 != 0))) {
    iVar3 = std::istream::peek();
    iVar3 = isblank(iVar3);
    if (iVar3 == 0) break;
    std::istream::get();
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_388);
  if (iVar3 == 0) {
    parse_value::anon_class_16_2_de30df33::operator()(&local_398);
    rhs = (undefined1 *)&value::undefined;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_388);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_388);
      if (iVar3 != 0) {
LAB_0011519e:
        iVar3 = std::__cxx11::string::compare((char *)&local_388);
        local_3a0 = __return_storage_ptr__;
        local_368 = s;
        local_360 = h;
        if ((iVar3 == 0) &&
           ((local_188 != local_190 ||
            (lVar5 = (**(code **)(local_1a0[0] + 0x38))(local_1a0), lVar5 != 0)))) {
          iVar3 = std::istream::peek();
          iVar3 = isalpha(iVar3);
          if (iVar3 == 0) {
            piVar4 = std::istream::_M_extract<double>((double *)local_1b0);
            if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
              parse_value::anon_class_16_2_de30df33::operator()(&local_398);
              __return_storage_ptr__->type_ = number;
              (__return_storage_ptr__->field_1).n_ = (double)local_338.heap_;
              goto LAB_001153b6;
            }
          }
          else {
            local_338._8_8_ = 0;
            local_328[0].pointers_.set_ =
                 (gc_heap_ptr_untyped **)((ulong)local_328[0].pointers_.set_ & 0xffffffffffffff00);
            local_338.heap_ = local_328;
            piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_338);
            if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
              parse_value::anon_class_16_2_de30df33::operator()(&local_398);
              uVar1 = local_338._8_8_;
              pgVar10 = local_338.heap_;
              if (local_338._8_8_ != 0) {
                lVar5 = 0;
                do {
                  iVar3 = tolower((int)*(char *)((long)&(pgVar10->pointers_).set_ + lVar5));
                  *(char *)((long)&(pgVar10->pointers_).set_ + lVar5) = (char)iVar3;
                  lVar5 = lVar5 + 1;
                } while (uVar1 != lVar5);
              }
              iVar3 = std::__cxx11::string::compare((char *)&local_338);
              if (iVar3 == 0) {
                uVar11 = 0x7ff00000;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_338);
                s = local_368;
                if (iVar3 != 0) goto LAB_00115487;
                uVar11 = 0x7ff80000;
              }
              local_3a0->type_ = number;
              (local_3a0->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
              heap_ = (gc_heap *)((ulong)uVar11 << 0x20);
              __return_storage_ptr__ = local_3a0;
              if (local_338.heap_ == local_328) goto LAB_001153b6;
              goto LAB_00115612;
            }
LAB_00115487:
            if (local_338.heap_ != local_328) {
              operator_delete(local_338.heap_,(long)local_328[0].pointers_.set_ + 1);
            }
          }
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_388);
        if ((iVar3 != 0) || (iVar3 = std::istream::get(), iVar3 != 0x27)) {
LAB_0011564d:
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3c0,"Invalid test spec value \"",s);
          plVar6 = (long *)std::__cxx11::string::append(local_3c0);
          local_338.heap_ = (gc_heap *)*plVar6;
          pgVar10 = (gc_heap *)(plVar6 + 2);
          if (local_338.heap_ == pgVar10) {
            local_328[0].pointers_.set_ = (pgVar10->pointers_).set_;
            local_328[0].pointers_._8_8_ = plVar6[3];
            local_338.heap_ = local_328;
          }
          else {
            local_328[0].pointers_.set_ = (pgVar10->pointers_).set_;
          }
          local_338._8_8_ = plVar6[1];
          *plVar6 = (long)pgVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::runtime_error::runtime_error(this,(string *)&local_338);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_3c0._0_8_ = local_3c0 + 0x10;
        local_3c0._8_8_ = (wchar_t *)0x0;
        local_3c0._16_4_ = 0;
        bVar8 = false;
LAB_00115222:
        if ((local_188 == local_190) &&
           (lVar5 = (**(code **)(local_1a0[0] + 0x38))(local_1a0), lVar5 == 0)) {
          s = local_368;
          if ((gc_heap *)local_3c0._0_8_ != (gc_heap *)(local_3c0 + 0x10)) {
            operator_delete((void *)local_3c0._0_8_,
                            CONCAT44(local_3c0._20_4_,local_3c0._16_4_) * 4 + 4);
            s = local_368;
          }
          goto LAB_0011564d;
        }
        uVar2 = std::istream::get();
        if (!bVar8) goto LAB_00115278;
        if (uVar2 < 0x62) {
          if (((uVar2 != 0x22) && (uVar2 != 0x27)) && (uVar2 != 0x5c))
          goto switchD_001152a9_caseD_6f;
        }
        else {
          switch(uVar2) {
          case 0x6e:
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
switchD_001152a9_caseD_6f:
            std::__cxx11::wostringstream::wostringstream((wostringstream *)&local_338);
            pwVar7 = std::operator<<((wostream *)&local_338,"Not implemented: ");
            pwVar7 = std::operator<<(pwVar7,"Unhandled escape sequence \\");
            std::operator<<(pwVar7,(char)uVar2);
            std::__cxx11::wstringbuf::str();
            local_1c0._M_len = (size_t)local_358[0]._M_str;
            local_1c0._M_str = (wchar_t *)local_358[0]._M_len;
            throw_runtime_error(&local_1c0,
                                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                                ,0x76);
          case 0x72:
            break;
          case 0x74:
            break;
          case 0x75:
            get_escape_sequence((istream *)local_1b0);
            break;
          case 0x76:
            break;
          default:
            if ((uVar2 != 0x62) && (uVar2 != 0x66)) goto switchD_001152a9_caseD_6f;
          }
        }
LAB_0011528e:
        bVar8 = false;
        std::__cxx11::wstring::push_back((wchar_t)local_3c0);
        goto LAB_00115222;
      }
      local_338._8_8_ = 0;
      local_328[0].pointers_.set_ =
           (gc_heap_ptr_untyped **)((ulong)local_328[0].pointers_.set_ & 0xffffffffffffff00);
      local_338.heap_ = local_328;
      piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_338);
      if ((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) ||
         ((iVar3 = std::__cxx11::string::compare((char *)&local_338), iVar3 != 0 &&
          (iVar3 = std::__cxx11::string::compare((char *)&local_338), iVar3 != 0)))) {
        if (local_338.heap_ != local_328) {
          operator_delete(local_338.heap_,(long)local_328[0].pointers_.set_ + 1);
        }
        goto LAB_0011519e;
      }
      parse_value::anon_class_16_2_de30df33::operator()(&local_398);
      iVar3 = std::__cxx11::string::compare((char *)&local_338);
      __return_storage_ptr__->type_ = boolean;
      (__return_storage_ptr__->field_1).b_ = iVar3 == 0;
      if (local_338.heap_ == local_328) goto LAB_001153b6;
LAB_00115612:
      uVar9 = (long)local_328[0].pointers_.set_ + 1;
      pgVar10 = local_338.heap_;
LAB_00115396:
      operator_delete(pgVar10,uVar9);
      goto LAB_001153b6;
    }
    parse_value::anon_class_16_2_de30df33::operator()(&local_398);
    rhs = value::null;
  }
  value::value(__return_storage_ptr__,(value *)rhs);
LAB_001153b6:
  if (local_388 != (undefined8 *)&local_378) {
    operator_delete(local_388,CONCAT71(uStack_377,local_378) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
LAB_00115278:
  bVar8 = true;
  if (uVar2 == 0x5c) goto LAB_00115222;
  if (uVar2 == 0x27) {
    parse_value::anon_class_16_2_de30df33::operator()(&local_398);
    local_358[0]._M_len = local_3c0._8_8_;
    local_358[0]._M_str = (wchar_t *)local_3c0._0_8_;
    string::string((string *)&local_338,local_360,local_358);
    __return_storage_ptr__ = local_3a0;
    local_3a0->type_ = string;
    (local_3a0->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         local_338.heap_;
    *(uint32_t *)((long)&local_3a0->field_1 + 8) = local_338.pos_;
    if (local_338.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_338.heap_,(gc_heap_ptr_untyped *)&(local_3a0->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_338);
    if ((gc_heap *)local_3c0._0_8_ == (gc_heap *)(local_3c0 + 0x10)) goto LAB_001153b6;
    uVar9 = CONCAT44(local_3c0._20_4_,local_3c0._16_4_) * 4 + 4;
    pgVar10 = (gc_heap *)local_3c0._0_8_;
    goto LAB_00115396;
  }
  goto LAB_0011528e;
}

Assistant:

value parse_value(gc_heap& h, const std::string& s) {
    std::istringstream iss{s};
    std::string type;

    auto require_complete = [&]() {
        if (iss.rdbuf()->in_avail()) {
            throw std::runtime_error("Invalid test spec. Parse not complete in \"" + s + "\" Unparsed: \"" + s.substr(iss.tellg()) + "\"");
        }
    };

    if (iss >> type) {
        while (iss.rdbuf()->in_avail() && isblank(iss.peek()))
            iss.get();

        if (type == "undefined") {
            require_complete();
            return value::undefined;
        } else if (type == "null") {
            require_complete();
            return value::null;
        } else if (type == "boolean") {
            std::string val;
            if ((iss >> val) && (val == "true" || val == "false")) {
                require_complete();
                return mjs::value{val == "true"};
            }
        }
        if (type == "number" && iss.rdbuf()->in_avail()) {
            if (isalpha(iss.peek())) {
                std::string name;
                if (iss >> name) {
                    require_complete();
                    for (auto& c: name) c = static_cast<char>(tolower(c));
                    if (name == "infinity") return mjs::value{INFINITY};
                    if (name == "nan") return mjs::value{NAN};
                }
            } else {
                double val;
                if (iss >> val) {
                    require_complete();
                    return value{val};
                }
            }
        }
        if (type == "string" && iss.get() == '\'') {
            std::wstring res;
            bool escape = false;
            while (iss.rdbuf()->in_avail()) {
                const auto ch = static_cast<uint16_t>(iss.get());
                if (escape)  {
                    switch (ch) {
                    case 'b': res.push_back('\x08'); break;
                    case 't': res.push_back('\t'); break;
                    case 'n': res.push_back('\n'); break;
                    case 'v': res.push_back('\x0b'); break;
                    case 'f': res.push_back('\x0c'); break;
                    case 'r': res.push_back('\r'); break;
                    case 'u': res.push_back(get_escape_sequence(iss)); break;
                    case '\"': [[fallthrough]];
                    case '\'': [[fallthrough]];
                    case '\\': res.push_back(ch); break;
                    default:
                        NOT_IMPLEMENTED("Unhandled escape sequence \\" << (char)ch);
                    }
                    escape = false;
                } else if (ch == '\\') {
                    escape = true;
                } else if (ch == '\'') {
                    require_complete();
                    return value{mjs::string{h, res}};
                } else {
                    res.push_back(ch);
                }
            }
        }
    }
    throw std::runtime_error("Invalid test spec value \"" + s + "\"");
}